

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writebmp.cpp
# Opt level: O2

void writeBMP(char *filename,char *data,int W,int H)

{
  uint uVar1;
  FILE *__s;
  long lVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  int x;
  ulong uVar6;
  bool bVar7;
  char h [54];
  
  __s = fopen(filename,"wb");
  h[0x10] = '\0';
  h[0x11] = '\0';
  h[0x1b] = '\0';
  h[0x20] = '\0';
  h[0x21] = '\0';
  h[0x22] = '\0';
  h[0x23] = '\0';
  h[0x24] = '\0';
  h[0x25] = '\0';
  h[0x26] = '\0';
  h[0x27] = '\0';
  h[0x28] = '\0';
  h[0x29] = '\0';
  h[0x2a] = '\0';
  h[0x2b] = '\0';
  h[0x2c] = '\0';
  h[0x2d] = '\0';
  h[0x2e] = '\0';
  h[0x2f] = '\0';
  h[0x30] = '\0';
  h[0x31] = '\0';
  h[0x32] = '\0';
  h[0x33] = '\0';
  h[0x34] = '\0';
  h[0x35] = '\0';
  h[8] = '\0';
  h[9] = '\0';
  h[10] = '6';
  h[0xb] = '\0';
  h[0xc] = '\0';
  h[0xd] = '\0';
  h[0xe] = '(';
  h[0xf] = '\0';
  h[0x1a] = '\x01';
  h[0x1c] = '\x18';
  h[0x1d] = '\0';
  h[0x1e] = '\0';
  h[0x1f] = '\0';
  h._2_4_ = ((W * 3 + 3) / 4) * H * 4 + 0x36;
  h[0] = 'B';
  h[1] = 'M';
  h[6] = '\0';
  h[7] = '\0';
  h._18_4_ = W;
  h._22_4_ = H;
  fwrite(h,0x36,1,__s);
  uVar1 = W;
  if (W < 1) {
    uVar1 = 0;
  }
  lVar2 = (long)H;
  iVar3 = (H + -1) * W * 3;
  while (bVar7 = lVar2 != 0, lVar2 = lVar2 + -1, bVar7) {
    pcVar4 = data + iVar3;
    for (uVar6 = 0; lVar5 = 3, uVar6 != uVar1; uVar6 = uVar6 + 1) {
      while (lVar5 != 0) {
        fputc((int)pcVar4[lVar5 + -1],__s);
        lVar5 = lVar5 + -1;
      }
      pcVar4 = pcVar4 + 3;
    }
    fwrite(h + 0x1e,1,(long)(W % 4),__s);
    iVar3 = iVar3 + W * -3;
  }
  fclose(__s);
  return;
}

Assistant:

void writeBMP(const char* filename, char* data, int W, int H)
// data: RGB, top left -> bottom right, no padding
{
	FILE* fout = fopen(filename, "wb");
	char h[54] = "BM";
	h[10] = 54; // header size
	h[14] = 40; // info size
	h[26] = 1;
	h[28] = 24; // bit per pixel
	int size = 54 + (W*3+3)/4*4*H;
	memcpy(h+2, &size, 4);
	memcpy(h+18, &W, 4);
	memcpy(h+22, &H, 4);
	fwrite(h, 54, 1, fout);
	for (int y=H-1; ~y; --y) {
		for (int x=0; x<W; ++x)
			for (int k=2; ~k; --k) // RGB -> BGR
				fwrite(data+y*W*3+x*3+k, 1, 1, fout);
		// pad to 4n bytes per row
		fwrite(h+30, 1, W%4, fout);
	}
	fclose(fout);
}